

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::insertpoint_abort(tetgenmesh *this,face *splitseg,insertvertexflags *ivf)

{
  triface *t;
  uint local_34;
  int i;
  face *parysh;
  triface *cavetet;
  insertvertexflags *ivf_local;
  face *splitseg_local;
  tetgenmesh *this_local;
  
  for (local_34 = 0; (long)(int)local_34 < this->caveoldtetlist->objects; local_34 = local_34 + 1) {
    t = (triface *)
        (this->caveoldtetlist->toparray
         [(int)local_34 >> ((byte)this->caveoldtetlist->log2objectsperblock & 0x1f)] +
        (int)((local_34 & this->caveoldtetlist->objectsperblockmark) *
             this->caveoldtetlist->objectbytes));
    uninfect(this,t);
    unmarktest(this,t);
  }
  for (local_34 = 0; (long)(int)local_34 < this->cavebdrylist->objects; local_34 = local_34 + 1) {
    unmarktest(this,(triface *)
                    (this->cavebdrylist->toparray
                     [(int)local_34 >> ((byte)this->cavebdrylist->log2objectsperblock & 0x1f)] +
                    (int)((local_34 & this->cavebdrylist->objectsperblockmark) *
                         this->cavebdrylist->objectbytes)));
  }
  arraypool::restart(this->cavetetlist);
  arraypool::restart(this->cavebdrylist);
  arraypool::restart(this->caveoldtetlist);
  arraypool::restart(this->cavetetseglist);
  arraypool::restart(this->cavetetshlist);
  if (ivf->splitbdflag != 0) {
    if ((splitseg != (face *)0x0) && (splitseg->sh != (shellface *)0x0)) {
      sunmarktest(this,splitseg);
    }
    for (local_34 = 0; (long)(int)local_34 < this->caveshlist->objects; local_34 = local_34 + 1) {
      sunmarktest(this,(face *)(this->caveshlist->toparray
                                [(int)local_34 >>
                                 ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
                               (int)((local_34 & this->caveshlist->objectsperblockmark) *
                                    this->caveshlist->objectbytes)));
    }
    arraypool::restart(this->caveshlist);
    arraypool::restart(this->cavesegshlist);
  }
  return;
}

Assistant:

void tetgenmesh::insertpoint_abort(face *splitseg, insertvertexflags *ivf)
{
  triface *cavetet;
  face *parysh;
  int i;

  for (i = 0; i < caveoldtetlist->objects; i++) {
    cavetet = (triface *) fastlookup(caveoldtetlist, i);
    uninfect(*cavetet);
    unmarktest(*cavetet);
  }
  for (i = 0; i < cavebdrylist->objects; i++) {
    cavetet = (triface *) fastlookup(cavebdrylist, i);
    unmarktest(*cavetet); 
  }
  cavetetlist->restart();
  cavebdrylist->restart();
  caveoldtetlist->restart();
  cavetetseglist->restart();
  cavetetshlist->restart();
  if (ivf->splitbdflag) { 
    if ((splitseg != NULL) && (splitseg->sh != NULL)) {
      sunmarktest(*splitseg);
    }
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      sunmarktest(*parysh);
    }
    caveshlist->restart();
    cavesegshlist->restart();
  }
}